

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.h
# Opt level: O1

int __thiscall
CLogarithmicScrollbarScale::ToAbsolute
          (CLogarithmicScrollbarScale *this,float RelativeValue,int Min,int Max)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = 0;
  if (Min < this->m_MinAdjustment) {
    iVar1 = this->m_MinAdjustment;
  }
  dVar2 = log((double)(Max + iVar1));
  dVar3 = log((double)(Min + iVar1));
  dVar4 = log((double)(Min + iVar1));
  dVar2 = exp(dVar4 + (dVar2 - dVar3) * (double)RelativeValue);
  return (int)((float)dVar2 + *(float *)(&DAT_001dca3c + (ulong)(0.0 < (float)dVar2) * 4)) - iVar1;
}

Assistant:

int ToAbsolute(float RelativeValue, int Min, int Max) const
	{
		int ResultAdjustment = 0;
		if(Min < m_MinAdjustment)
		{
			Min += m_MinAdjustment;
			Max += m_MinAdjustment;
			ResultAdjustment = -m_MinAdjustment;
		}
		return round_to_int(exp(RelativeValue*(log(Max) - log(Min)) + log(Min))) + ResultAdjustment;
	}